

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O0

int ffgcls2(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp
           ,char *nulval,char **array,char *nularray,int *anynul,int *status)

{
  char *pcVar1;
  int iVar2;
  long local_72c8;
  long local_72c0;
  char *local_7248;
  char *arrayptr;
  char *buffer;
  double cbuff [3600];
  tcolumn *colptr;
  char snull [20];
  char local_188 [8];
  char message [81];
  char local_128 [8];
  char tform [20];
  double local_108;
  double zero;
  double scale;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long jj;
  long ii;
  long incre;
  long twidth;
  int nulcheck;
  int hdutype;
  int maxelem;
  int tcode;
  long nullen;
  double dtemp;
  size_t sStack_60;
  int nultyp_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (nelem != 0)) {
    dtemp._4_4_ = nultyp;
    sStack_60 = nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    if (dtemp._4_4_ == 2) {
      memset(nularray,0,sStack_60);
    }
    if (((int)firstrow_local._4_4_ < 1) || (pfStack_40->Fptr->tfield < (int)firstrow_local._4_4_)) {
      snprintf(local_188,0x51,"Specified column number is out of range: %d",
               (ulong)firstrow_local._4_4_);
      ffpmsg(local_188);
      *status = 0x12e;
      fptr_local._4_4_ = 0x12e;
    }
    else {
      hdutype = pfStack_40->Fptr->tableptr[(int)(firstrow_local._4_4_ - 1)].tdatatype;
      if (hdutype == -0x10) {
        iVar2 = ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,1,1,0,&zero,&local_108,
                         local_128,&incre,&hdutype,&nulcheck,&elemnum,&readptr,&ii,&startpos,&rownum
                         ,(int *)((long)&twidth + 4),&rowlen,(char *)&colptr,status);
        if (0 < iVar2) {
          return *status;
        }
        next = 1;
        incre = startpos;
      }
      else {
        if (hdutype != 0x10) {
          *status = 0x135;
          return 0x135;
        }
        iVar2 = ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,sStack_60,0,
                         &zero,&local_108,local_128,&incre,&hdutype,&nulcheck,&elemnum,&readptr,&ii,
                         &startpos,&rownum,(int *)((long)&twidth + 4),&rowlen,(char *)&colptr,status
                        );
        if (0 < iVar2) {
          return *status;
        }
        if (0xb40 < incre) {
          nulcheck = 1;
          ii = incre;
          startpos = 1;
        }
        next = sStack_60;
      }
      _maxelem = strlen((char *)&colptr);
      if (_maxelem == 0) {
        _maxelem = 1;
      }
      twidth._0_4_ = dtemp._4_4_;
      if ((dtemp._4_4_ == 1) && (nulval == (char *)0x0)) {
        twidth._0_4_ = 0;
      }
      else if ((dtemp._4_4_ == 1) && ((nulval != (char *)0x0 && (*nulval == '\0')))) {
        twidth._0_4_ = 0;
      }
      else if ((char)colptr == '\x01') {
        twidth._0_4_ = 0;
      }
      else if (incre < (long)_maxelem) {
        twidth._0_4_ = 0;
      }
      scale = 0.0;
      remain = 0;
      while (next != 0) {
        if (next < nulcheck) {
          local_72c0 = next;
        }
        else {
          local_72c0 = (long)nulcheck;
        }
        if (local_72c0 < startpos - readptr) {
          local_72c8 = local_72c0;
        }
        else {
          local_72c8 = startpos - readptr;
        }
        repeat = local_72c8;
        tnull = elemnum + remain * rownum + readptr * ii;
        ffmbyt(pfStack_40,tnull,0,status);
        if (ii == incre) {
          ffgbyt(pfStack_40,repeat * incre,&buffer,status);
        }
        else {
          ffgbytoff(pfStack_40,incre,repeat,ii - incre,&buffer,status);
        }
        arrayptr = (char *)((long)&arrayptr + repeat * incre + 7);
        jj = (long)scale + repeat;
        while (jj = jj + -1, (long)scale <= jj) {
          pcVar1 = array[jj] + incre;
          ntodo = incre;
          while( true ) {
            ntodo = ntodo + -1;
            local_7248 = pcVar1 + -1;
            if ((ntodo < 1) || (*arrayptr != ' ')) break;
            arrayptr = arrayptr + -1;
            pcVar1 = local_7248;
          }
          *pcVar1 = '\0';
          for (; -1 < ntodo; ntodo = ntodo + -1) {
            *local_7248 = *arrayptr;
            arrayptr = arrayptr + -1;
            local_7248 = local_7248 + -1;
          }
          if (((int)twidth != 0) &&
             (iVar2 = strncmp((char *)&colptr,array[jj],_maxelem), iVar2 == 0)) {
            *anynul = 1;
            if (dtemp._4_4_ == 1) {
              if (nulval == (char *)0x0) {
                strcpy(array[jj]," ");
              }
              else {
                strcpy(array[jj],nulval);
              }
            }
            else {
              nularray[jj] = '\x01';
            }
          }
        }
        if (0 < *status) {
          nullen = (long)(double)(long)scale;
          snprintf(local_188,0x51,"Error reading elements %.0f thru %.0f of data array (ffpcls).",
                   (double)nullen + 1.0,(double)nullen + (double)repeat);
          ffpmsg(local_188);
          return *status;
        }
        scale = (double)(repeat + (long)scale);
        next = next - repeat;
        if ((next != 0) && (readptr = repeat + readptr, readptr == startpos)) {
          readptr = 0;
          remain = remain + 1;
        }
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcls2 ( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st) */
            LONGLONG  nelem,      /* I - number of strings to read              */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char  *nulval,    /* I - value for null pixels if nultyp = 1     */
            char **array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of string values from a column in the current FITS HDU.
*/
{
    double dtemp;
    long nullen; 
    int tcode, maxelem, hdutype, nulcheck;
    long twidth, incre;
    long ii, jj, ntodo;
    LONGLONG repeat, startpos, elemnum, readptr, tnull, rowlen, rownum, remain, next;
    double scale, zero;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    tcolumn *colptr;

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    char *buffer, *arrayptr;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = colptr->tdatatype;

    if (tcode == -TSTRING) /* variable length column in a binary table? */
    {
      /* only read a single string; ignore value of firstelem */

      if (ffgcprll( fptr, colnum, firstrow, 1, 1, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      remain = 1;
      twidth = (long) repeat;  
    }
    else if (tcode == TSTRING)
    {
      if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      /* if string length is greater than a FITS block (2880 char) then must */
      /* only read 1 string at a time, to force reading by ffgbyt instead of */
      /* ffgbytoff (ffgbytoff can't handle this case) */
      if (twidth > IOBUFLEN) {
        maxelem = 1;
        incre = twidth;
        repeat = 1;
      }   

      remain = nelem;
    }
    else
        return(*status = NOT_ASCII_COL);

    nullen = strlen(snull);   /* length of the undefined pixel string */
    if (nullen == 0)
        nullen = 1;
 
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (nultyp == 1 && nulval && nulval[0] == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (snull[0] == ASCII_NULL_UNDEFINED)
       nulcheck = 0;   /* null value string in ASCII table not defined */

    else if (nullen > twidth)
       nulcheck = 0;   /* null value string is longer than width of column  */
                       /* thus impossible for any column elements to = null */

    /*---------------------------------------------------------------------*/
    /*  Now read the strings one at a time from the FITS column.           */
    /*---------------------------------------------------------------------*/
    next = 0;                 /* next element in array to be read  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      /* limit the number of pixels to process at one time to the number that
         will fit in the buffer space or to the number of pixels that remain
         in the current vector, which ever is smaller.
      */
      ntodo = (long) minvalue(remain, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);
      ffmbyt(fptr, readptr, REPORT_EOF, status);  /* move to read position */

      /* read the array of strings from the FITS file into the buffer */

      if (incre == twidth)
         ffgbyt(fptr, ntodo * twidth, cbuff, status);
      else
         ffgbytoff(fptr, twidth, ntodo, incre - twidth, cbuff, status);

      /* copy from the buffer into the user's array of strings */
      /* work backwards from last char of last string to 1st char of 1st */

      buffer = ((char *) cbuff) + (ntodo * twidth) - 1;

      for (ii = (long) (next + ntodo - 1); ii >= next; ii--)
      {
         arrayptr = array[ii] + twidth - 1;

         for (jj = twidth - 1; jj > 0; jj--)  /* ignore trailing blanks */
         {
            if (*buffer == ' ')
            {
              buffer--;
              arrayptr--;
            }
            else
              break;
         }
         *(arrayptr + 1) = 0;  /* write the string terminator */
         
         for (; jj >= 0; jj--)    /* copy the string itself */
         {
           *arrayptr = *buffer;
           buffer--;
           arrayptr--;
         }

         /* check if null value is defined, and if the   */
         /* column string is identical to the null string */
         if (nulcheck && !strncmp(snull, array[ii], nullen) )
         {
           *anynul = 1;   /* this is a null value */
           if (nultyp == 1) {
	   
	     if (nulval)
                strcpy(array[ii], nulval);
	     else
	        strcpy(array[ii], " ");
	     
           } else
             nularray[ii] = 1;
         }
      }
    
      if (*status > 0)  /* test for error during previous read operation */
      {
         dtemp = (double) next;
         snprintf(message,FLEN_ERRMSG,
          "Error reading elements %.0f thru %.0f of data array (ffpcls).",
             dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      next += ntodo;
      remain -= ntodo;
      if (remain)
      {
          elemnum += ntodo;
          if (elemnum == repeat)  /* completed a row; start on next row */
          {
              elemnum = 0;
              rownum++;
          }
      }
    }  /*  End of main while Loop  */

    return(*status);
}